

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseStructDeclaration(StructuralParser *this)

{
  Expression *type_00;
  StructDeclaration *this_00;
  bool bVar1;
  ModuleBase *pMVar2;
  Identifier memberName;
  Context local_80;
  Expression *local_68;
  Expression *type;
  pool_ref<soul::AST::StructDeclaration> local_58;
  StructDeclaration *local_50;
  StructDeclaration *newStruct;
  Identifier local_30;
  Identifier name;
  Context context;
  StructuralParser *this_local;
  
  getContext((Context *)&name,this);
  local_30 = parseIdentifier(this);
  newStruct = (StructDeclaration *)anon_var_dwarf_10eeb4;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"{");
  local_50 = allocate<soul::AST::StructDeclaration,soul::AST::Context&,soul::Identifier&>
                       (this,(Context *)&name,&local_30);
  pMVar2 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  pool_ref<soul::AST::StructDeclaration>::pool_ref<soul::AST::StructDeclaration,void>
            (&local_58,local_50);
  std::
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  ::push_back(&pMVar2->structures,&local_58);
  pool_ref<soul::AST::StructDeclaration>::~pool_ref(&local_58);
  while( true ) {
    type = (Expression *)0x54ceac;
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54ceac);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_68 = parseType(this,structMember);
    do {
      this_00 = local_50;
      type_00 = local_68;
      getContext(&local_80,this);
      memberName = parseIdentifier(this);
      AST::StructDeclaration::addMember(this_00,type_00,&local_80,memberName);
      AST::Context::~Context(&local_80);
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    } while (bVar1);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
  }
  giveErrorOnSemicolon(this);
  AST::Context::~Context((Context *)&name);
  return;
}

Assistant:

void parseStructDeclaration()
    {
        auto context = getContext();
        auto name = parseIdentifier();
        expect (Operator::openBrace);

        auto& newStruct = allocate<AST::StructDeclaration> (context, name);
        module->structures.push_back (newStruct);

        while (! matchIf (Operator::closeBrace))
        {
            auto& type = parseType (ParseTypeContext::structMember);

            for (;;)
            {
                newStruct.addMember (type, getContext(), parseIdentifier());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::semicolon);
                break;
            }
        }

        giveErrorOnSemicolon();
    }